

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.h
# Opt level: O3

DiagnosticStream * __thiscall
spvtools::DiagnosticStream::operator<<(DiagnosticStream *this,char **val)

{
  char *__s;
  size_t sVar1;
  
  __s = *val;
  if (__s == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  return this;
}

Assistant:

DiagnosticStream& operator<<(const T& val) {
    stream_ << val;
    return *this;
  }